

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_tags(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
         error_code *ec)

{
  size_t sVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  sVar1 = (this->source_).buffer_length_;
  do {
    if ((sVar1 == 0) &&
       (stream_source<unsigned_char>::fill_buffer(&this->source_),
       (this->source_).buffer_length_ == 0)) {
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      return;
    }
    if ((*(this->source_).buffer_data_ & 0xe0) != 0xc0) {
      return;
    }
    uVar2 = get_uint64_value(this,ec);
    if (ec->_M_value != 0) {
      return;
    }
    uVar3 = (this->other_tags_).super__Base_bitset<1UL>._M_w;
    if (uVar2 == 0x100) {
      uVar3 = uVar3 | 2;
LAB_00163e89:
      (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar3;
    }
    else {
      if (uVar2 == 0x19) {
        uVar3 = uVar3 | 1;
        goto LAB_00163e89;
      }
      (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar3 | 4;
      this->raw_tag_ = uVar2;
    }
    sVar1 = (this->source_).buffer_length_;
  } while( true );
}

Assistant:

void read_tags(std::error_code& ec)
    {
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);

        while (major_type == jsoncons::cbor::detail::cbor_major_type::semantic_tag)
        {
            uint64_t val = get_uint64_value(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            switch(val)
            {
                case 25: // stringref
                    other_tags_[stringref_tag] = true;
                    break;
                case 256: // stringref-namespace
                    other_tags_[stringref_namespace_tag] = true;
                    break;
                default:
                    other_tags_[item_tag] = true;
                    raw_tag_ = val;
                    break;
            }
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = cbor_errc::unexpected_eof;
                more_ = false;
                return;
            }
            major_type = get_major_type(c.value);
        }
    }